

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void lws_context_destroy(lws_context *context)

{
  byte bVar1;
  ushort uVar2;
  lws_context **pplVar3;
  _func_int_lws_context_ptr *p_Var4;
  lws_vhost *plVar5;
  allocated_headers *ah;
  lws_role_ops *plVar6;
  pollfd *ptr;
  bool bVar7;
  uint uVar8;
  lws_log_cx *cx;
  lws_event_loop_ops *plVar9;
  lws_system_blob_t *b;
  lws *wsi;
  long lVar10;
  int iVar11;
  int iVar12;
  lws_system_blob_item_t type;
  ulong uVar13;
  lws_context_per_thread *plVar14;
  lws_vhost *plVar15;
  lws_log_cx_t *cx_00;
  char *format;
  lws_role_ops **ppxx_1;
  lws_role_ops **pplVar16;
  uint uVar17;
  lws_context_per_thread *plVar18;
  lws_role_ops **ppxx;
  
  if (context == (lws_context *)0x0) {
    return;
  }
  if ((*(ushort *)&context->field_0x7b7 & 2) != 0) {
    return;
  }
  pplVar3 = context->pcontext_finalize;
  *(ushort *)&context->field_0x7b7 = *(ushort *)&context->field_0x7b7 | 2;
  uVar8 = (uint)context->destroy_state;
  _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_context_destroy",
              "destroy_state %d",uVar8);
  switch(context->destroy_state) {
  case '\0':
    break;
  case '\x01':
    goto switchD_0010aee3_caseD_1;
  case '\x02':
    uVar8 = (uint)context->count_threads;
    goto LAB_0010af88;
  case '\x03':
    plVar9 = context->event_loop_ops;
    goto LAB_0010b110;
  default:
    goto switchD_0010aee3_default;
  }
  plVar15 = (lws_vhost *)0x0;
  _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_context_destroy",
              "starting context destroy flow",uVar8);
  uVar2 = *(ushort *)&context->field_0x7b7;
  *(ushort *)&context->field_0x7b7 = uVar2 | 4;
  if ((uVar2 & 0x40) != 0) {
    plVar15 = context->vhost_list;
  }
  while (plVar15 != (lws_vhost *)0x0) {
    cx = lwsl_vhost_get_cx(plVar15);
    _lws_log_cx(cx,lws_log_prepend_vhost,plVar15,8,"lws_context_destroy","start close",uVar8);
    plVar5 = plVar15->vhost_next;
    lws_vhost_destroy1(plVar15);
    plVar15 = plVar5;
  }
  lws_plat_context_early_destroy(context);
  context->field_0x7b7 = context->field_0x7b7 | 0x28;
switchD_0010aee3_caseD_1:
  plVar18 = context->pt;
  bVar7 = false;
  plVar14 = plVar18;
  for (uVar17 = 0; uVar17 < context->count_threads; uVar17 = uVar17 + 1) {
    bVar1 = plVar14->field_0x19b;
    plVar14->field_0x19b = bVar1 | 0x20;
    if ((bVar1 & 2) == 0) {
      while (plVar14->fds_count != 0) {
        wsi = wsi_from_fd(context,plVar14->fds->fd);
        if (wsi != (lws *)0x0) {
          uVar8 = uVar17;
          _lws_log_cx(context->log_cx,lws_log_prepend_context,context,0x10,"lws_context_destroy",
                      "pt %d: closing wsi %p: role %s",uVar17,wsi,wsi->role_ops->name);
          lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS_CONTEXT_DESTROY,"ctx destroy");
          if (plVar14->pipe_wsi == wsi) {
            plVar14->pipe_wsi = (lws *)0x0;
          }
        }
      }
      if (context->event_loop_ops->destroy_pt != (_func_void_lws_context_ptr_int *)0x0) {
        uVar8 = uVar17;
        _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_context_destroy",
                    "calling evlib destroy_pt %d\n",uVar17);
        (*context->event_loop_ops->destroy_pt)(context,uVar17);
      }
    }
    else {
      plVar14->field_0x19b = bVar1 | 0x30;
      bVar7 = true;
    }
    plVar14 = plVar14 + 1;
  }
  if (bVar7) {
    context->destroy_state = '\x01';
    _lws_log_cx(context->log_cx,lws_log_prepend_context,context,4,"lws_context_destroy",
                "destroy from inside service",uVar8);
    lws_cancel_service(context);
  }
  else {
    context->destroy_state = '\x02';
    if (context->event_loop_ops->destroy_context1 == (_func_int_lws_context_ptr *)0x0) {
      _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_context_destroy",
                  "manually destroying pts",uVar8);
      for (uVar17 = 0; uVar8 = (uint)context->count_threads, uVar17 < uVar8; uVar17 = uVar17 + 1) {
        plVar18->field_0x19b = plVar18->field_0x19b | 0x10;
        lws_pt_destroy(plVar18);
        plVar18 = plVar18 + 1;
      }
LAB_0010af88:
      iVar11 = 0;
      for (lVar10 = 0; (ulong)uVar8 * 0x1a0 - lVar10 != 0; lVar10 = lVar10 + 0x1a0) {
        iVar11 = iVar11 + (uint)((*(byte *)((long)context->lcg + lVar10 + -0x4d) & 0x50) == 0);
      }
      iVar12 = iVar11;
      _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_context_destroy",
                  "PT_WAIT_ALL_DESTROYED: %d alive",iVar11);
      if (iVar11 == 0) {
        p_Var4 = context->event_loop_ops->destroy_context2;
        if (p_Var4 != (_func_int_lws_context_ptr *)0x0) {
          (*p_Var4)(context);
        }
        context->field_0x7b7 = context->field_0x7b7 | 0x20;
        lws_state_transition(&context->mgr_system,0xd);
        plVar15 = context->vhost_list;
        while (plVar15 != (lws_vhost *)0x0) {
          plVar5 = plVar15->vhost_next;
          __lws_vhost_destroy2(plVar15);
          plVar15 = plVar5;
        }
        while (context->vhost_pending_destruction_list != (lws_vhost *)0x0) {
          __lws_vhost_destroy2(context->vhost_pending_destruction_list);
        }
        lws_ssl_context_destroy(context);
        lws_plat_context_late_destroy(context);
        for (uVar13 = 0; uVar13 < context->count_threads; uVar13 = uVar13 + 1) {
          plVar18 = context->pt + uVar13;
          pplVar16 = available_roles;
          while (plVar6 = *pplVar16, plVar6 != (lws_role_ops *)0x0) {
            pplVar16 = pplVar16 + 1;
            if ((plVar6->rops_idx[0] & 0xf) != 0) {
              (*plVar6->rops_table[(plVar6->rops_idx[0] & 0xf) - 1].check_upgrades)((lws *)context);
            }
          }
          while (ah = (plVar18->http).ah_list, ah != (allocated_headers *)0x0) {
            _lws_destroy_ah(plVar18,ah);
          }
          iVar12 = (int)uVar13;
          _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_context_destroy",
                      "pt destroy %d",iVar12);
          lws_pt_destroy(plVar18);
        }
        context->destroy_state = '\x03';
        plVar9 = context->event_loop_ops;
        if ((context->pt[0].field_0x19b & 4) == 0) {
          if (plVar9->destroy_context1 == (_func_int_lws_context_ptr *)0x0) {
LAB_0010b110:
            context->field_0x7b8 = context->field_0x7b8 | 2;
            if (plVar9->destroy_context2 != (_func_int_lws_context_ptr *)0x0) {
              (*plVar9->destroy_context2)(context);
            }
            uVar13 = 0;
            while( true ) {
              if (context->count_threads <= uVar13) {
                lws_cache_destroy(&context->nsc);
                lws_cache_destroy(&context->l1);
                _lws_smd_destroy(context);
                ptr = context->pt[0].fds;
                if (ptr != (pollfd *)0x0) {
                  lws_realloc(ptr,0,"free");
                  context->pt[0].fds = (pollfd *)0x0;
                }
                lws_context_deinit_ssl_library(context);
                for (type = LWS_SYSBLOB_TYPE_AUTH; type != LWS_SYSBLOB_TYPE_COUNT; type = type + 1)
                {
                  b = lws_system_get_blob(context,type,0);
                  lws_system_blob_destroy(b);
                }
                free(context->external_baggage_free_on_destroy);
                lwsl_refcount_cx(context->log_cx,-1);
                lws_realloc(context,0,"lws_free");
                if (pplVar3 == (lws_context **)0x0) {
                  return;
                }
                *pplVar3 = (lws_context *)0x0;
                return;
              }
              plVar18 = context->pt;
              pplVar16 = available_roles;
              while (plVar6 = *pplVar16, plVar6 != (lws_role_ops *)0x0) {
                pplVar16 = pplVar16 + 1;
                if ((plVar6->rops_idx[0] & 0xf) != 0) {
                  (*plVar6->rops_table[(plVar6->rops_idx[0] & 0xf) - 1].check_upgrades)
                            ((lws *)context);
                }
              }
              if ((plVar18[uVar13].field_0x19b & 0x40) != 0) break;
              plVar18[uVar13].field_0x19b = plVar18[uVar13].field_0x19b & 0x9f | 0x40;
              _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_context_destroy",
                          "pt %d fully destroyed",
                          (int)((long)((long)plVar18 +
                                      (-0x280 - (long)plVar18[uVar13].context) + uVar13 * 0x1a0) /
                               0x1a0));
              uVar13 = uVar13 + 1;
            }
            __assert_fail("!pt->is_destroyed",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/core/context.c"
                          ,0x830,"void lws_context_destroy(struct lws_context *)");
          }
          cx_00 = context->log_cx;
          format = "waiting for internal loop exit";
          iVar11 = 4;
        }
        else {
          if (plVar9->destroy_context1 == (_func_int_lws_context_ptr *)0x0) goto LAB_0010b110;
          cx_00 = context->log_cx;
          format = "leaving final context destruction for final call";
          iVar11 = 8;
        }
        _lws_log_cx(cx_00,lws_log_prepend_context,context,iVar11,"lws_context_destroy",format,iVar12
                   );
      }
    }
    else {
      _lws_log_cx(context->log_cx,lws_log_prepend_context,context,8,"lws_context_destroy",
                  "do evlib destroy_context1 and wait",uVar8);
      (*context->event_loop_ops->destroy_context1)(context);
    }
  }
switchD_0010aee3_default:
  _lws_log(8,"%s: leaving\n","lws_context_destroy");
  context->field_0x7b7 = context->field_0x7b7 & 0xfd;
  return;
}

Assistant:

void
lws_context_destroy(struct lws_context *context)
{
	struct lws_context **pcontext_finalize;
#if defined(LWS_WITH_NETWORK)
	struct lws_context_per_thread *pt;
	struct lws_vhost *vh = NULL, *vh1;
	int alive = 0, deferred_pt = 0;
#endif
#if defined(LWS_WITH_PEER_LIMITS)
	uint32_t nu;
#endif
	int n;

	if (!context || context->inside_context_destroy)
		return;

	pcontext_finalize = context->pcontext_finalize;

	lws_context_lock(context, __func__);
	context->inside_context_destroy = 1;

	lwsl_cx_info(context, "destroy_state %d", context->destroy_state);

	switch (context->destroy_state) {
	case LWSCD_NO_DESTROY:
		/*
		 * We're getting started
		 */

		lwsl_cx_info(context, "starting context destroy flow");
		context->being_destroyed = 1;

#if defined(LWS_WITH_NETWORK)

		/*
		 * Close any vhost listen wsi
		 *
		 * inform all the protocols that they are done and will have no
		 * more callbacks.
		 *
		 * We can't free things until after the event loop shuts down.
		 */

		if (context->protocol_init_done)
			vh = context->vhost_list;

		while (vh) {
			lwsl_vhost_info(vh, "start close");
			vh1 = vh->vhost_next;
			lws_vhost_destroy1(vh);
			vh = vh1;
		}
#endif

		lws_plat_context_early_destroy(context);

		context->service_no_longer_possible = 1;
		context->requested_stop_internal_loops = 1;

		/* fallthru */

	case LWSCD_PT_WAS_DEFERRED:

#if defined(LWS_WITH_NETWORK)

		/*
		 * We want to mark the pts as their destruction having been
		 * initiated, so they will reject any new wsi, and iterate all
		 * existing pt wsi starting to close them.
		 *
		 * If the event loop has async close, we have to return after
		 * this and try again when all the loops stop after all the
		 * refcounted wsi are gone.
		 */

		pt = context->pt;
		for (n = 0; n < context->count_threads; n++) {
			lws_pt_lock(pt, __func__);

			/* evlib will realize it needs to destroy pt */
			pt->destroy_self = 1;

			if (pt->inside_lws_service) {
				pt->event_loop_pt_unused = 1;
				deferred_pt = 1;
				goto next;
			}

			/*
			 * Close every handle in the fds
			 */

			while (pt->fds_count) {
				struct lws *wsi = wsi_from_fd(context,
							      pt->fds[0].fd);

				if (wsi) {

					lwsl_cx_debug(context,
						"pt %d: closing wsi %p: role %s",
						n, wsi, wsi->role_ops->name);

					lws_close_free_wsi(wsi,
						LWS_CLOSE_STATUS_NOSTATUS_CONTEXT_DESTROY,
						"ctx destroy"
						/* no protocol close */);

					if (pt->pipe_wsi == wsi)
						pt->pipe_wsi = NULL;
				}
			}

#if defined(LWS_WITH_CGI)
			(lws_rops_func_fidx(&role_ops_cgi,
					    LWS_ROPS_pt_init_destroy)).
					    pt_init_destroy(context, NULL,
							    pt, 1);
#endif

			/*
			 * This closes handles that belong to the evlib pt
			 * footprint, eg, timers, idle
			 */

			if (context->event_loop_ops->destroy_pt) {
				lwsl_cx_info(context,
					     "calling evlib destroy_pt %d\n", n);
				context->event_loop_ops->destroy_pt(context, n);
			}

next:
			lws_pt_unlock(pt);

			pt++;
		}

		if (deferred_pt) {
			context->destroy_state = LWSCD_PT_WAS_DEFERRED;
			lwsl_cx_notice(context, "destroy from inside service");
			lws_cancel_service(context);
			goto bail;
		}
#endif
		context->destroy_state = LWSCD_PT_WAIT_ALL_DESTROYED;

		/*
		 * We have different needs depending if foreign loop or not.
		 *
		 * 1) If foreign loop, we really want to advance the
		 *    destroy_context() past here, and block only for libuv-
		 *    style async close completion.
		 *
		 * 2a) If poll, and we exited by ourselves and are calling a
		 *     final destroy_context() outside of any service already,
		 *     we want to advance all the way in one step.
		 *
		 * 2b) If poll, and we are reacting to a SIGINT, service
		 *     thread(s) may be in poll wait or servicing.  We can't
		 *     advance the destroy_context() to the point it's freeing
		 *     things; we have to leave that for the final
		 *     destroy_context() after the service thread(s) are
		 *     finished calling for service.
		 */

#if defined(LWS_WITH_NETWORK)
		if (context->event_loop_ops->destroy_context1) {
			lwsl_cx_info(context, "do evlib destroy_context1 and wait");
			context->event_loop_ops->destroy_context1(context);

			goto bail;
		}

		/*
		 * ...if the more typical sync close, we can clean up the pts
		 * now ourselves...
		 */

		lwsl_cx_info(context, "manually destroying pts");

		pt = context->pt;
		for (n = 0; n < context->count_threads; n++, pt++) {
			pt->event_loop_pt_unused = 1;
			lws_pt_destroy(pt);
		}
#endif
		/* fallthru */

	case LWSCD_PT_WAIT_ALL_DESTROYED:

#if defined(LWS_WITH_NETWORK)

		for (n = 0; n < context->count_threads; n++)
			if (!context->pt[n].is_destroyed &&
			    !context->pt[n].event_loop_pt_unused)
				alive++;

		lwsl_cx_info(context, "PT_WAIT_ALL_DESTROYED: %d alive", alive);

		if (alive)
			break;

		/*
		 * With foreign loops, removing all our fds from the loop
		 * means there are no more ways for the foreign loop to give
		 * us any further CPU once we leave here... so we must make
		 * sure related service threads are exiting so we can pick up
		 * again at the original app thread and do the context
		 * destroy completion
		 */

		/*
		 * evlib specific loop destroy?
		 */
		if (context->event_loop_ops->destroy_context2)
			/*
			 * He returns nonzero to indicate the evlib must
			 * continue around the loop before destroy of it is
			 * completed so it can be freed
			 */
			context->event_loop_ops->destroy_context2(context);
		context->requested_stop_internal_loops = 1;
#endif

		/*
		 * Every pt and wsi that may depend on the logical vhosts
		 * is destroyed.  We can remove the logical vhosts.
		 */

#if defined(LWS_WITH_SYS_STATE) && defined(LWS_WITH_NETWORK)
	lws_state_transition(&context->mgr_system, LWS_SYSTATE_POLICY_INVALID);
#endif

#if defined(LWS_WITH_NETWORK)
		/*
		 * free all the per-vhost allocations
		 */

		vh = context->vhost_list;
		while (vh) {
			vh1 = vh->vhost_next;
		//	lwsl_debug("%s: vh %s destroy2\n", __func__, vh->name);
			__lws_vhost_destroy2(vh);
			vh = vh1;
		}

		/* remove ourselves from the pending destruction list */

		while (context->vhost_pending_destruction_list)
			/* removes itself from list */
			__lws_vhost_destroy2(context->vhost_pending_destruction_list);
#endif

#if defined(LWS_WITH_NETWORK)
		lws_ssl_context_destroy(context);
#endif
		lws_plat_context_late_destroy(context);

#if defined(LWS_WITH_PEER_LIMITS)
		for (nu = 0; nu < context->pl_hash_elements; nu++)	{
			lws_start_foreach_llp(struct lws_peer **, peer,
					      context->pl_hash_table[nu]) {
				struct lws_peer *df = *peer;
				*peer = df->next;
				lws_free(df);
				continue;
			} lws_end_foreach_llp(peer, next);
		}
		lws_free(context->pl_hash_table);
#endif

#if defined(LWS_WITH_NETWORK)

		for (n = 0; n < context->count_threads; n++) {
			struct lws_context_per_thread *pt = &context->pt[n];

			(void)pt;
#if defined(LWS_WITH_SEQUENCER)
			lws_seq_destroy_all_on_pt(pt);
#endif
			LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
				if (lws_rops_fidx(ar, LWS_ROPS_pt_init_destroy))
					(lws_rops_func_fidx(ar, LWS_ROPS_pt_init_destroy)).
						pt_init_destroy(context, NULL, pt, 1);
			} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

#if defined(LWS_WITH_CGI)
			lws_rops_func_fidx(&role_ops_cgi,
					   LWS_ROPS_pt_init_destroy).
					        pt_init_destroy(context, NULL,
					        		pt, 1);
#endif

#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
			while (pt->http.ah_list)
				_lws_destroy_ah(pt, pt->http.ah_list);
#endif
			lwsl_cx_info(context, "pt destroy %d", n);
			lws_pt_destroy(pt);
		}
#endif /* NETWORK */

		context->destroy_state = LWSCD_FINALIZATION;

#if defined(LWS_WITH_NETWORK)

		if (context->pt[0].event_loop_foreign &&
		    context->event_loop_ops->destroy_context1) {

			lwsl_cx_info(context,
				    "leaving final context destruction"
					" for final call");
			goto bail;
		}

		if (context->event_loop_ops->destroy_context1 &&
		    !context->pt[0].event_loop_foreign) {
			lwsl_cx_notice(context, "waiting for internal loop exit");

			goto bail;
		}
#endif
		/* fallthru */

	case LWSCD_FINALIZATION:

#if defined(LWS_WITH_SYS_METRICS)
		lws_metrics_dump(context);
#endif

		context->evlib_finalize_destroy_after_int_loops_stop = 1;

#if defined(LWS_WITH_NETWORK)
		if (context->event_loop_ops->destroy_context2)
			context->event_loop_ops->destroy_context2(context);

		/*
		 * finalize destroy of pt and things hanging off it
		 */

		for (n = 0; n < context->count_threads; n++) {
			struct lws_context_per_thread *pt = &context->pt[n];

			/*
			 * Destroy the pt-roles
			 */

			LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar) {
				if (lws_rops_fidx(ar, LWS_ROPS_pt_init_destroy))
					(lws_rops_func_fidx(ar, LWS_ROPS_pt_init_destroy)).
							pt_init_destroy(context, NULL, pt, 1);
			} LWS_FOR_EVERY_AVAILABLE_ROLE_END;

		#if defined(LWS_WITH_CGI)
			lws_rops_func_fidx(&role_ops_cgi, LWS_ROPS_pt_init_destroy).
						pt_init_destroy(context, NULL, pt, 1);
		#endif

			lws_pt_mutex_destroy(pt);
			assert(!pt->is_destroyed);
			pt->destroy_self = 0;
			pt->is_destroyed = 1;

			lwsl_cx_info(context, "pt %d fully destroyed",
					(int)(pt - pt->context->pt));
		}

		/*
		 * wsis are gone, pts are gone, vhosts are gone.
		 *
		 * clean up the context and things hanging off it
		 */

#if defined(LWS_WITH_TLS_JIT_TRUST)
		lws_cache_destroy(&context->trust_cache);
		lws_tls_jit_trust_inflight_destroy_all(context);
#endif

#if defined(LWS_WITH_CACHE_NSCOOKIEJAR) && defined(LWS_WITH_CLIENT)
		lws_cache_destroy(&context->nsc);
		lws_cache_destroy(&context->l1);
#endif

#if defined(LWS_WITH_SYS_SMD)
		_lws_smd_destroy(context);
#endif

#if defined(LWS_WITH_SYS_ASYNC_DNS)
		lws_async_dns_deinit(&context->async_dns);
#endif
#if defined(LWS_WITH_SYS_DHCP_CLIENT)
		lws_dhcpc_remove(context, NULL);
#endif

		if (context->pt[0].fds)
			lws_free_set_NULL(context->pt[0].fds);
#endif
		lws_context_deinit_ssl_library(context);

#if defined(LWS_WITH_DETAILED_LATENCIES)
		if (context->latencies_fd != -1)
			compatible_close(context->latencies_fd);
#endif

		for (n = 0; n < LWS_SYSBLOB_TYPE_COUNT; n++)
			lws_system_blob_destroy(
					lws_system_get_blob(context, (lws_system_blob_item_t)n, 0));

#if defined(LWS_WITH_NETWORK) && defined(LWS_WITH_SECURE_STREAMS) && \
	!defined(LWS_WITH_SECURE_STREAMS_STATIC_POLICY_ONLY)

		while (context->server_der_list) {
			struct lws_ss_x509 *x = context->server_der_list;

			context->server_der_list = x->next;
			lws_free((void *)x->ca_der);
		}

		if (context->ac_policy)
			lwsac_free(&context->ac_policy);
#endif

		/*
		 * Context lock is about to go away
		 */

		lws_context_unlock(context);

#if LWS_MAX_SMP > 1
		lws_mutex_refcount_destroy(&context->mr);
#endif

#if defined(LWS_WITH_SYS_METRICS) && defined(LWS_WITH_NETWORK)
		lws_metrics_destroy(context);
#endif

		if (context->external_baggage_free_on_destroy)
			free(context->external_baggage_free_on_destroy);

#if defined(LWS_PLAT_FREERTOS)
#if defined(LWS_AMAZON_RTOS)
		context->last_free_heap = xPortGetFreeHeapSize();
#else
		context->last_free_heap = esp_get_free_heap_size();
#endif
#endif

#if defined(LWS_WITH_EVLIB_PLUGINS) && defined(LWS_WITH_EVENT_LIBS)
		if (context->evlib_plugin_list)
			lws_plugins_destroy(&context->evlib_plugin_list,
					    NULL, NULL);
#endif

#if defined(LWS_WITH_SYS_FAULT_INJECTION)
		lws_fi_destroy(&context->fic);
#endif

		lwsl_refcount_cx(context->log_cx, -1);

		lws_free(context);

		if (pcontext_finalize)
			*pcontext_finalize = NULL;

		return;
	}

#if defined(LWS_WITH_NETWORK)
bail:
#endif
	lwsl_info("%s: leaving\n", __func__);
	context->inside_context_destroy = 0;
	lws_context_unlock(context);
}